

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

int Abc_SclComputeParametersCell(SC_Lib *p,SC_Cell *pCell,float Slew,float *pLD,float *pPD)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int local_54;
  float local_50;
  int i;
  float pd;
  float ld;
  float PD;
  float LD;
  SC_Pin *pPin;
  float *pPD_local;
  float *pLD_local;
  SC_Cell *pSStack_20;
  float Slew_local;
  SC_Cell *pCell_local;
  SC_Lib *p_local;
  
  local_50 = 0.0;
  i = 0;
  pd = 0.0;
  ld = 0.0;
  local_54 = 0;
  pPin = (SC_Pin *)pPD;
  pPD_local = pLD;
  pLD_local._4_4_ = Slew;
  pSStack_20 = pCell;
  pCell_local = (SC_Cell *)p;
  while( true ) {
    fVar2 = ld;
    if (pSStack_20->n_inputs <= local_54) {
      iVar3 = Abc_MaxInt(1,pSStack_20->n_inputs);
      fVar1 = pd;
      *pPD_local = fVar2 / (float)iVar3;
      iVar3 = Abc_MaxInt(1,pSStack_20->n_inputs);
      *(float *)&pPin->pName = fVar1 / (float)iVar3;
      return 1;
    }
    _PD = Vec_PtrEntry(&pSStack_20->vPins,local_54);
    iVar3 = Abc_SclComputeParametersPin
                      ((SC_Lib *)pCell_local,pSStack_20,local_54,pLD_local._4_4_,(float *)&i,
                       &local_50);
    if (iVar3 == 0) break;
    ld = (float)i + ld;
    pd = local_50 + pd;
    local_54 = local_54 + 1;
  }
  return 0;
}

Assistant:

int Abc_SclComputeParametersCell( SC_Lib * p, SC_Cell * pCell, float Slew, float * pLD, float * pPD )
{
    SC_Pin * pPin;
    float LD, PD, ld, pd;
    int i;
    LD = PD = ld = pd = 0;
    SC_CellForEachPinIn( pCell, pPin, i )
    {
        if ( !Abc_SclComputeParametersPin( p, pCell, i, Slew, &ld, &pd ) )
            return 0;
        LD += ld; PD += pd;
    }
    *pLD = LD / Abc_MaxInt(1, pCell->n_inputs);
    *pPD = PD / Abc_MaxInt(1, pCell->n_inputs);
    return 1;
}